

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall Graphics::Graphics(Graphics *this)

{
  GameTitle *this_00;
  value_type this_01;
  value_type local_30;
  GameTitle *local_28 [3];
  Graphics *local_10;
  Graphics *this_local;
  
  local_10 = this;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::vector(&this->animations);
  Screen::Screen(&this->screen);
  this_00 = (GameTitle *)operator_new(0x108);
  GameTitle::GameTitle(this_00);
  local_28[0] = this_00;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::push_back
            (&this->animations,(value_type *)local_28);
  this_01 = (value_type)operator_new(0x48);
  *(undefined8 *)&this_01->field_0x30 = 0;
  *(undefined8 *)&this_01->field_0x38 = 0;
  *(undefined8 *)&this_01->field_0x20 = 0;
  *(undefined8 *)&this_01->description = 0;
  *(undefined8 *)&this_01->field_0x10 = 0;
  *(undefined8 *)&this_01->field_0x18 = 0;
  ((Animation *)&this_01->_vptr_Animation)->_vptr_Animation = (_func_int **)0x0;
  *(undefined8 *)&this_01->name = 0;
  *(undefined8 *)&this_01->field_0x40 = 0;
  Fireworks::Fireworks((Fireworks *)this_01);
  local_30 = this_01;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::push_back(&this->animations,&local_30);
  return;
}

Assistant:

Graphics::Graphics(){
    // Create the animations array
    animations.push_back(new GameTitle());
    animations.push_back(new Fireworks());

    // TODO: Create the menus
}